

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O0

uint8_t * __thiscall
editions_unittest::NotGroupLikeScope::_InternalSerialize
          (NotGroupLikeScope *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t *puVar4;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  NotGroupLikeScope *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  NotGroupLikeScope *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    iVar3 = _internal_a(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar3,target);
  }
  if ((uVar1 & 2) != 0) {
    iVar3 = _internal_b(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NotGroupLikeScope::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NotGroupLikeScope& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:editions_unittest.NotGroupLikeScope)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_a(), target);
  }

  // int32 b = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_b(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:editions_unittest.NotGroupLikeScope)
  return target;
}